

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParsingTests.cpp
# Opt level: O0

void testScopedName(string_view text)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  bool bVar1;
  ExpressionSyntax *pEVar2;
  ExprLhs<const_slang::syntax::SyntaxKind_&> lhs;
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  EVar3;
  AssertionHandler *this;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  ExpressionSyntax *expr;
  string *in_stack_000004d0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar4;
  OfType in_stack_fffffffffffffcec;
  AssertionHandler *in_stack_fffffffffffffcf0;
  SourceManager *in_stack_fffffffffffffcf8;
  Diagnostics *in_stack_fffffffffffffd00;
  SourceLineInfo *this_00;
  char *in_stack_fffffffffffffd08;
  char *pcVar5;
  SyntaxKind *in_stack_fffffffffffffd10;
  size_type sVar6;
  ExprLhs<const_slang::syntax::SyntaxKind_&> *in_stack_fffffffffffffd18;
  Flags FVar7;
  allocator<char> *in_stack_fffffffffffffd20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string_view<char,_std::char_traits<char>_> *rhs;
  SyntaxNode *in_stack_fffffffffffffd58;
  StringRef local_258;
  SourceLineInfo local_248;
  StringRef local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  StringRef local_180;
  SourceLineInfo local_170;
  StringRef local_160;
  undefined4 local_108;
  SyntaxKind *local_100;
  StringRef local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  StringRef local_a8;
  allocator<char> local_39 [33];
  ExpressionSyntax *local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  FVar7 = (Flags)in_stack_fffffffffffffd20;
  pEVar2 = parseExpression(in_stack_000004d0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf0);
  std::allocator<char>::~allocator(local_39);
  local_18 = pEVar2;
  local_a8 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffcf0,
                        CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  rhs = &local_b8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)rhs,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
             ,0xdb);
  local_c8 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffcf0,
                        CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  uVar4 = 1;
  macroName.m_size = (size_type)in_stack_fffffffffffffd10;
  macroName.m_start = in_stack_fffffffffffffd08;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd00;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffcf8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffcf0,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffcec,1),capturedExpression,FVar7);
  lhs = Catch::operator<=<const_slang::syntax::SyntaxKind_&,_0>
                  ((Decomposer *)CONCAT44(in_stack_fffffffffffffcec,uVar4),(SyntaxKind *)0x59a1b0);
  local_108 = 0x1a1;
  local_100 = lhs.m_lhs;
  Catch::operator==(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffcf0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffcec,uVar4));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffcf0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffcf0);
  local_160 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffcf0,CONCAT44(in_stack_fffffffffffffcec,uVar4)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
             ,0xdc);
  local_180 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffcf0,CONCAT44(in_stack_fffffffffffffcec,uVar4)
                        );
  uVar4 = 2;
  macroName_00.m_size = (size_type)in_stack_fffffffffffffd10;
  macroName_00.m_start = in_stack_fffffffffffffd08;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffd00;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffffcf8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffcf0,macroName_00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffcec,2),capturedExpression_00,FVar7);
  slang::syntax::SyntaxNode::toString_abi_cxx11_(in_stack_fffffffffffffd58);
  EVar3 = Catch::
          operator<=<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffcec,uVar4),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59a371);
  local_1b8 = EVar3.m_lhs;
  Catch::operator==((ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)lhs.m_lhs,rhs);
  FVar7 = (Flags)EVar3.m_lhs;
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffcf0,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffcec,uVar4));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf0);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffcf0);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffcf0);
  getSourceManager();
  slang::Diagnostics::sort(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  bVar1 = slang::SmallVectorBase<slang::Diagnostic>::empty
                    ((SmallVectorBase<slang::Diagnostic> *)slang::diagnostics);
  if (!bVar1) {
    local_238 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffcf0,
                           CONCAT44(in_stack_fffffffffffffcec,uVar4));
    this_00 = &local_248;
    Catch::SourceLineInfo::SourceLineInfo
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
               ,0xdd);
    pcVar5 = (char *)0x0;
    sVar6 = 0;
    local_258.m_start = (char *)0x0;
    local_258.m_size = 0;
    Catch::StringRef::StringRef(&local_258);
    uVar4 = 2;
    macroName_01.m_size = sVar6;
    macroName_01.m_start = pcVar5;
    capturedExpression_01.m_size = (size_type)this_00;
    capturedExpression_01.m_start = (char *)in_stack_fffffffffffffcf8;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffffcf0,macroName_01,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffcec,2),capturedExpression_01,FVar7);
    Catch::MessageStream::MessageStream((MessageStream *)0x59a567);
    reportGlobalDiags_abi_cxx11_();
    Catch::operator+(&stack0xfffffffffffffd58);
    this = (AssertionHandler *)
           Catch::MessageStream::operator<<
                     ((MessageStream *)in_stack_fffffffffffffcf0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffffcec,uVar4));
    Catch::ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffcec,uVar4));
    Catch::AssertionHandler::handleMessage(this,in_stack_fffffffffffffcec,(string *)0x59a5cd);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    Catch::MessageStream::~MessageStream((MessageStream *)0x59a5f3);
    Catch::AssertionHandler::complete(this);
    Catch::AssertionHandler::~AssertionHandler(this);
  }
  return;
}

Assistant:

void testScopedName(std::string_view text) {
    auto& expr = parseExpression(std::string(text));

    REQUIRE(expr.kind == SyntaxKind::ScopedName);
    CHECK(expr.toString() == text);
    CHECK_DIAGNOSTICS_EMPTY;
}